

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatbase.c
# Opt level: O3

int ecx_FPWR(ecx_portt *port,uint16 ADP,uint16 ADO,uint16 length,void *data,int timeout)

{
  uint8 *puVar1;
  uint uVar2;
  int iVar3;
  undefined2 in_register_0000000a;
  uint uVar4;
  uint8 *frameP;
  uint idx;
  
  uVar4 = CONCAT22(in_register_0000000a,length);
  uVar2 = ecx_getindex(port);
  idx = uVar2 & 0xff;
  *(uint16 *)(port->txbuf[idx] + 0xe) = length + 0x100c;
  port->txbuf[idx][0x10] = '\x05';
  port->txbuf[idx][0x11] = (uint8)uVar2;
  *(uint16 *)(port->txbuf[idx] + 0x12) = ADP;
  *(uint16 *)(port->txbuf[idx] + 0x14) = ADO;
  *(uint16 *)(port->txbuf[idx] + 0x16) = length;
  if (uVar4 != 0) {
    memcpy(port->txbuf[idx] + 0x1a,data,(ulong)uVar4);
  }
  puVar1 = port->txbuf[idx] + (ulong)uVar4 + 0x1a;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  port->txbuflength[idx] = length + 0x1c;
  iVar3 = ecx_srconfirm(port,idx,timeout);
  ecx_setbufstat(port,idx,0);
  return iVar3;
}

Assistant:

int ecx_FPWR(ecx_portt *port, uint16 ADP, uint16 ADO, uint16 length, void *data, int timeout)
{
   int wkc;
   uint8 idx;

   idx = ecx_getindex(port);
   ecx_setupdatagram(port, &(port->txbuf[idx]), EC_CMD_FPWR, idx, ADP, ADO, length, data);
   wkc = ecx_srconfirm(port, idx, timeout);
   ecx_setbufstat(port, idx, EC_BUF_EMPTY);

   return wkc;
}